

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_rectangle_rounded(rf_rec rec,float roundness,int segments,rf_color color)

{
  rf_vec2 rVar1;
  _Bool _Var2;
  float fVar3;
  float y;
  float x;
  float x_00;
  float y_00;
  float x_01;
  float y_01;
  float x_02;
  float y_02;
  float x_03;
  float y_03;
  float fVar4;
  float fVar5;
  float local_fc;
  long local_f8;
  rf_int i;
  float fStack_e8;
  rf_vec2 center;
  float angle;
  rf_int k;
  float angles [4];
  rf_vec2 centers [4];
  rf_vec2 point [12];
  float step_length;
  float th;
  float CIRCLE_ERROR_RATE;
  float radius;
  int local_24;
  float local_20;
  int segments_local;
  float roundness_local;
  rf_color color_local;
  rf_rec rec_local;
  
  roundness_local = rec.x;
  color_local = (rf_color)rec.y;
  rec_local.x = rec.width;
  rec_local.y = rec.height;
  if (((roundness <= 0.0) || (rec_local.x < 1.0)) || (rec_local.y < 1.0)) {
    rf_draw_rectangle_pro(rec,(rf_vec2)0x0,0.0,color);
  }
  else {
    local_20 = roundness;
    if (1.0 <= roundness) {
      local_20 = 1.0;
    }
    fVar3 = rec_local.x;
    if (rec_local.y < rec_local.x) {
      fVar3 = rec_local.y;
    }
    local_fc = (fVar3 * local_20) / 2.0;
    if (0.0 < local_fc) {
      local_24 = segments;
      if (segments < 4) {
        fVar3 = powf(1.0 - 0.5 / local_fc,2.0);
        fVar3 = acosf(fVar3 + fVar3 + -1.0);
        fVar3 = ceilf(6.2831855 / fVar3);
        local_24 = (int)(fVar3 / 4.0);
        if (local_24 < 1) {
          local_24 = 4;
        }
      }
      fVar3 = 90.0 / (float)local_24;
      y = ((float)color_local + rec_local.y) - local_fc;
      x = (roundness_local + rec_local.x) - local_fc;
      x_00 = roundness_local + local_fc;
      y_00 = (float)color_local + local_fc;
      x_01 = (roundness_local + rec_local.x) - local_fc;
      y_01 = (float)color_local + local_fc;
      x_02 = (roundness_local + rec_local.x) - local_fc;
      y_02 = ((float)color_local + rec_local.y) - local_fc;
      x_03 = roundness_local + local_fc;
      y_03 = ((float)color_local + rec_local.y) - local_fc;
      angles[3] = y_00;
      angles[2] = x_00;
      angles[0] = 0.0;
      angles[1] = 270.0;
      _Var2 = rf_gfx_check_buffer_limit(local_24 * 0xc + 0x1e);
      if (_Var2) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_TRIANGLES);
      stack0xffffffffffffff20 = 0;
      while( true ) {
        segments_local._0_1_ = color.r;
        segments_local._1_1_ = color.g;
        segments_local._2_1_ = color.b;
        segments_local._3_1_ = color.a;
        if (3 < stack0xffffffffffffff20) break;
        center.x = angles[stack0xffffffffffffff20 + -2];
        rVar1 = centers[stack0xffffffffffffff20 + -1];
        for (local_f8 = 0; local_f8 < local_24; local_f8 = local_f8 + 1) {
          rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                          segments_local._3_1_);
          i._4_4_ = rVar1.x;
          fStack_e8 = rVar1.y;
          rf_gfx_vertex2f(i._4_4_,fStack_e8);
          fVar4 = sinf(center.x * 0.017453292);
          fVar5 = cosf(center.x * 0.017453292);
          rf_gfx_vertex2f(fVar4 * local_fc + i._4_4_,fVar5 * local_fc + fStack_e8);
          fVar4 = sinf((center.x + fVar3) * 0.017453292);
          fVar5 = cosf((center.x + fVar3) * 0.017453292);
          rf_gfx_vertex2f(fVar4 * local_fc + i._4_4_,fVar5 * local_fc + fStack_e8);
          center.x = fVar3 + center.x;
        }
        register0x00000000 = stack0xffffffffffffff20 + 1;
      }
      rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                      segments_local._3_1_);
      rf_gfx_vertex2f(roundness_local + local_fc,(float)color_local);
      rf_gfx_vertex2f(x_00,y_00);
      rf_gfx_vertex2f(x_01,y_01);
      rf_gfx_vertex2f((roundness_local + rec_local.x) - local_fc,(float)color_local);
      rf_gfx_vertex2f(roundness_local + local_fc,(float)color_local);
      rf_gfx_vertex2f(x_01,y_01);
      rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                      segments_local._3_1_);
      rf_gfx_vertex2f(x_01,y_01);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(roundness_local + rec_local.x,y);
      rf_gfx_vertex2f(roundness_local + rec_local.x,(float)color_local + local_fc);
      rf_gfx_vertex2f(x_01,y_01);
      rf_gfx_vertex2f(roundness_local + rec_local.x,y);
      rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                      segments_local._3_1_);
      rf_gfx_vertex2f(x_03,y_03);
      rf_gfx_vertex2f(roundness_local + local_fc,(float)color_local + rec_local.y);
      rf_gfx_vertex2f(x,(float)color_local + rec_local.y);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(x_03,y_03);
      rf_gfx_vertex2f(x,(float)color_local + rec_local.y);
      rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                      segments_local._3_1_);
      rf_gfx_vertex2f(roundness_local,(float)color_local + local_fc);
      rf_gfx_vertex2f(roundness_local,((float)color_local + rec_local.y) - local_fc);
      rf_gfx_vertex2f(x_03,y_03);
      rf_gfx_vertex2f(x_00,y_00);
      rf_gfx_vertex2f(roundness_local,(float)color_local + local_fc);
      rf_gfx_vertex2f(x_03,y_03);
      rf_gfx_color4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                      segments_local._3_1_);
      rf_gfx_vertex2f(x_00,y_00);
      rf_gfx_vertex2f(x_03,y_03);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_vertex2f(x_01,y_01);
      rf_gfx_vertex2f(x_00,y_00);
      rf_gfx_vertex2f(x_02,y_02);
      rf_gfx_end();
    }
  }
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded(rf_rec rec, float roundness, int segments, rf_color color)
{
    // Not a rounded rectangle
    if ((roundness <= 0.0f) || (rec.width < 1) || (rec.height < 1 ))
    {
        rf_draw_rectangle_pro(rec, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 4;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;

    /*  Quick sketch to make sense of all of this (there are 9 parts to draw, also mark the 12 points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                    P1
     *       ____________________
     *     /|                    |\
     *    /1|          2         |3\
     *P7 /__|____________________|__\ P2
     *  /   |                    |  _\ P2
     *  |   |P8                P9|   |
     *  | 8 |          9         | 4 |
     *  | __|____________________|__ |
     *P6 \  |P11              P10|  / P3
     *    \7|          6         |5/
     *     \|____________________|/
     *     P5                    P4
     */

    const rf_vec2 point[12] = { // coordinates of the 12 points that define the rounded rect (the idea here is to make things easier)
            {(float)rec.x + radius, rec.y}, {(float)(rec.x + rec.width) - radius, rec.y}, { rec.x + rec.width, (float)rec.y + radius }, // PO, P1, P2
            {rec.x + rec.width, (float)(rec.y + rec.height) - radius}, {(float)(rec.x + rec.width) - radius, rec.y + rec.height}, // P3, P4
            {(float)rec.x + radius, rec.y + rec.height}, { rec.x, (float)(rec.y + rec.height) - radius}, {rec.x, (float)rec.y + radius}, // P5, P6, P7
            {(float)rec.x + radius, (float)rec.y + radius}, {(float)(rec.x + rec.width) - radius, (float)rec.y + radius}, // P8, P9
            {(float)(rec.x + rec.width) - radius, (float)(rec.y + rec.height) - radius}, {(float)rec.x + radius, (float)(rec.y + rec.height) - radius} // P10, P11
    };

    const rf_vec2 centers[4] = {point[8], point[9], point[10], point[11] };
    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };
    if (rf_gfx_check_buffer_limit(12*segments + 5*6)) rf_gfx_draw(); // 4 corners with 3 vertices per segment + 5 rectangles with 6 vertices each

    rf_gfx_begin(RF_TRIANGLES);
    // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
    for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
    {
        float angle = angles[k];
        const rf_vec2 center = centers[k];
        for (rf_int i = 0; i < segments; i++)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(center.x, center.y);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);
            angle += step_length;
        }
    }

    // [2] Upper rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[1].x, point[1].y);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);

    // [4] Right rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);
    rf_gfx_vertex2f(point[2].x, point[2].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);

    // [6] Bottom rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[5].x, point[5].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);

    // [8] Left rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[6].x, point[6].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);

    // [9] Middle rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_end();

}